

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O2

int remux_tiles(CommonTileParams *tiles,uint8_t *dst,uint32_t data_size,uint32_t max_tile_size,
               uint32_t max_tile_col_size,int *tile_size_bytes,int *tile_col_size_bytes)

{
  int sz;
  uint uVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint32_t uVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  int local_40;
  
  if (tiles->large_scale == 0) {
    iVar5 = 4;
    sz = iVar5;
    if (max_tile_size < 0x1000000) {
      if (max_tile_size < 0x10000) {
        sz = 2 - (uint)(max_tile_size < 0x100);
      }
      else {
        sz = 3;
      }
    }
  }
  else {
    sz = choose_size_bytes(max_tile_size,1);
    if (max_tile_col_size < 0x1000000) {
      if (max_tile_col_size < 0x10000) {
        iVar5 = 2 - (uint)(max_tile_col_size < 0x100);
      }
      else {
        iVar5 = 3;
      }
    }
    else {
      iVar5 = 4;
    }
  }
  *tile_size_bytes = sz;
  *tile_col_size_bytes = iVar5;
  uVar6 = data_size;
  if (iVar5 != 4 || sz != 4) {
    if (tiles->large_scale == 0) {
      uVar1 = tiles->rows * tiles->cols;
      uVar9 = 0;
      uVar2 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar2 = uVar9;
      }
      uVar4 = 0;
      iVar5 = 0;
      while( true ) {
        local_40 = (int)uVar2;
        uVar6 = (uint32_t)uVar9;
        if (local_40 == iVar5) break;
        if (uVar1 - 1 == iVar5) {
          iVar3 = data_size - uVar4;
        }
        else {
          iVar3 = *(int *)(dst + uVar4);
          uVar4 = uVar4 + 4;
          mem_put_varsize(dst + uVar9,sz,iVar3);
          iVar3 = iVar3 + 1;
          uVar9 = (ulong)(uVar6 + sz);
        }
        memmove(dst + uVar9,dst + uVar4,(long)iVar3);
        uVar4 = uVar4 + iVar3;
        uVar9 = (ulong)(uint)(iVar3 + (int)uVar9);
        iVar5 = iVar5 + 1;
      }
    }
    else {
      uVar6 = 0;
      uVar1 = sz * -8 + 0x20;
      if (3 < sz) {
        uVar1 = uVar6;
      }
      uVar2 = 0;
      for (iVar3 = 0; iVar3 < tiles->cols; iVar3 = iVar3 + 1) {
        if (iVar3 < tiles->cols + -1) {
          mem_put_varsize(dst + uVar6,iVar5,tiles->rows * (sz + -4) + *(int *)(dst + uVar2));
          uVar6 = uVar6 + iVar5;
          uVar2 = (ulong)((int)uVar2 + 4);
        }
        for (iVar8 = 0; iVar8 < tiles->rows; iVar8 = iVar8 + 1) {
          uVar4 = *(uint *)(dst + uVar2);
          uVar10 = (int)uVar2 + 4;
          uVar2 = (ulong)uVar10;
          if ((int)uVar4 < 0) {
            mem_put_varsize(dst + uVar6,sz,uVar4 >> ((byte)uVar1 & 0x1f));
            uVar6 = uVar6 + sz;
          }
          else {
            mem_put_varsize(dst + uVar6,sz,uVar4);
            memmove(dst + (uVar6 + sz),dst + uVar2,(ulong)uVar4 + 1);
            iVar7 = (int)((ulong)uVar4 + 1);
            uVar2 = (ulong)(uVar10 + iVar7);
            uVar6 = uVar6 + sz + iVar7;
          }
        }
      }
    }
  }
  return uVar6;
}

Assistant:

static int remux_tiles(const CommonTileParams *const tiles, uint8_t *dst,
                       const uint32_t data_size, const uint32_t max_tile_size,
                       const uint32_t max_tile_col_size,
                       int *const tile_size_bytes,
                       int *const tile_col_size_bytes) {
  // Choose the tile size bytes (tsb) and tile column size bytes (tcsb)
  int tsb;
  int tcsb;

  if (tiles->large_scale) {
    // The top bit in the tile size field indicates tile copy mode, so we
    // have 1 less bit to code the tile size
    tsb = choose_size_bytes(max_tile_size, 1);
    tcsb = choose_size_bytes(max_tile_col_size, 0);
  } else {
    tsb = choose_size_bytes(max_tile_size, 0);
    tcsb = 4;  // This is ignored
    (void)max_tile_col_size;
  }

  assert(tsb > 0);
  assert(tcsb > 0);

  *tile_size_bytes = tsb;
  *tile_col_size_bytes = tcsb;
  if (tsb == 4 && tcsb == 4) return data_size;

  uint32_t wpos = 0;
  uint32_t rpos = 0;

  if (tiles->large_scale) {
    int tile_row;
    int tile_col;

    for (tile_col = 0; tile_col < tiles->cols; tile_col++) {
      // All but the last column has a column header
      if (tile_col < tiles->cols - 1) {
        uint32_t tile_col_size = mem_get_le32(dst + rpos);
        rpos += 4;

        // Adjust the tile column size by the number of bytes removed
        // from the tile size fields.
        tile_col_size -= (4 - tsb) * tiles->rows;

        mem_put_varsize(dst + wpos, tcsb, tile_col_size);
        wpos += tcsb;
      }

      for (tile_row = 0; tile_row < tiles->rows; tile_row++) {
        // All, including the last row has a header
        uint32_t tile_header = mem_get_le32(dst + rpos);
        rpos += 4;

        // If this is a copy tile, we need to shift the MSB to the
        // top bit of the new width, and there is no data to copy.
        if (tile_header >> 31 != 0) {
          if (tsb < 4) tile_header >>= 32 - 8 * tsb;
          mem_put_varsize(dst + wpos, tsb, tile_header);
          wpos += tsb;
        } else {
          mem_put_varsize(dst + wpos, tsb, tile_header);
          wpos += tsb;

          tile_header += AV1_MIN_TILE_SIZE_BYTES;
          memmove(dst + wpos, dst + rpos, tile_header);
          rpos += tile_header;
          wpos += tile_header;
        }
      }
    }

    assert(rpos > wpos);
    assert(rpos == data_size);

    return wpos;
  }
  const int n_tiles = tiles->cols * tiles->rows;
  int n;

  for (n = 0; n < n_tiles; n++) {
    int tile_size;

    if (n == n_tiles - 1) {
      tile_size = data_size - rpos;
    } else {
      tile_size = mem_get_le32(dst + rpos);
      rpos += 4;
      mem_put_varsize(dst + wpos, tsb, tile_size);
      tile_size += AV1_MIN_TILE_SIZE_BYTES;
      wpos += tsb;
    }

    memmove(dst + wpos, dst + rpos, tile_size);

    rpos += tile_size;
    wpos += tile_size;
  }

  assert(rpos > wpos);
  assert(rpos == data_size);

  return wpos;
}